

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tflags.h
# Opt level: O2

void __thiscall AActor::PlayBounceSound(AActor *this,bool onfloor)

{
  ushort uVar1;
  int iVar2;
  FSoundID *sound_id;
  FSoundID local_c [3];
  
  uVar1 = (this->BounceFlags).Value;
  if ((uVar1 >> 9 & 1) == 0 && ((uVar1 >> 8 & 1) == 0 || onfloor)) {
    if ((char)uVar1 < '\0') {
      iVar2 = (this->SeeSound).super_FSoundID.ID;
      sound_id = local_c + 2;
    }
    else if ((onfloor) || (iVar2 = (this->WallBounceSound).super_FSoundID.ID, iVar2 < 1)) {
      iVar2 = (this->BounceSound).super_FSoundID.ID;
      sound_id = local_c + 1;
    }
    else {
      sound_id = local_c;
    }
    sound_id->ID = iVar2;
    S_Sound(this,2,sound_id,1.0,1.001);
  }
  return;
}

Assistant:

Self operator& (T value) const { return Self::FromInt (Value & value); }